

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O2

hash_t duckdb::HashBytes<true>(const_data_ptr_t ptr,idx_t len)

{
  hash_t hVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = len * -0x395b586ca42e166b ^ 0xe17a1465;
  for (uVar3 = 0; (len & 0xfffffffffffffff8) != uVar3; uVar3 = uVar3 + 8) {
    uVar2 = (uVar2 ^ *(ulong *)(ptr + uVar3)) * -0x2917014799a6026d;
  }
  if ((len & 7) != 0) {
    hVar1 = MurmurHash64((*(ulong *)(ptr + (len | 0xfffffffffffffff8) + (len & 0xfffffffffffffff8))
                          >> (-(char)(((uint)len & 7) << 3) & 0x3fU) ^ uVar2) * -0x2917014799a6026d)
    ;
    return hVar1;
  }
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  return uVar2 >> 0x20 ^ uVar2;
}

Assistant:

hash_t HashBytes(const_data_ptr_t ptr, const idx_t len) noexcept {
	// This seed slightly improves bit distribution, taken from here:
	// https://github.com/martinus/robin-hood-hashing/blob/3.11.5/LICENSE
	// MIT License Copyright (c) 2018-2021 Martin Ankerl
	hash_t h = 0xe17a1465U ^ (len * 0xc6a4a7935bd1e995U);

	// Hash/combine in blocks of 8 bytes
	const auto remainder = len & 7U;
	for (const auto end = ptr + len - remainder; ptr != end; ptr += 8U) {
		h ^= Load<hash_t>(ptr);
		h *= 0xd6e8feb86659fd93U;
	}

	if (remainder != 0) {
		if (AT_LEAST_8_BYTES) {
			D_ASSERT(len >= 8);
			// Load remaining (<8) bytes (with a Load instead of a memcpy)
			const auto inv_rem = 8U - remainder;
			const auto hr = Load<hash_t>(ptr - inv_rem) >> (inv_rem * 8U);

			h ^= hr;
			h *= 0xd6e8feb86659fd93U;
		} else {
			// Load remaining (<8) bytes (with a memcpy)
			hash_t hr = 0;
			memcpy(&hr, ptr, remainder);

			h ^= hr;
			h *= 0xd6e8feb86659fd93U;
		}
	}

	// Finalize
	return Hash(h);
}